

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O2

int coda_type_vsf_integer_set_type(coda_type_special *type,coda_type *base_type)

{
  coda_format format;
  int iVar1;
  coda_type_record_field *field;
  char *pcVar2;
  char *pcVar3;
  
  format = type->format;
  if (format == base_type->format) {
    if (type->base_type[1].name == (char *)0x1) {
      field = coda_type_record_field_new("value");
      if (field == (coda_type_record_field *)0x0) {
        return -1;
      }
      iVar1 = coda_type_record_field_set_type(field,base_type);
      if ((iVar1 == 0) &&
         (iVar1 = coda_type_record_add_field((coda_type_record *)type->base_type,field), iVar1 == 0)
         ) {
        type->bit_size = type->base_type->bit_size;
        return 0;
      }
      coda_type_record_field_delete(field);
      return -1;
    }
    coda_set_error(-400,"value should be second field of a vsf integer record");
  }
  else {
    pcVar2 = coda_type_get_format_name(base_type->format);
    pcVar3 = coda_type_get_format_name(format);
    coda_set_error(-400,"cannot use element type with %s format for vsf integer with %s format",
                   pcVar2,pcVar3);
  }
  return -1;
}

Assistant:

int coda_type_vsf_integer_set_type(coda_type_special *type, coda_type *base_type)
{
    coda_type_record_field *field;

    if (type->format != base_type->format)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION,
                       "cannot use element type with %s format for vsf integer with %s format",
                       coda_type_get_format_name(base_type->format), coda_type_get_format_name(type->format));
        return -1;
    }
    if (((coda_type_record *)type->base_type)->num_fields != 1)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "value should be second field of a vsf integer record");
        return -1;
    }

    field = coda_type_record_field_new("value");
    if (field == NULL)
    {
        return -1;
    }
    if (coda_type_record_field_set_type(field, base_type) != 0)
    {
        coda_type_record_field_delete(field);
        return -1;
    }
    if (coda_type_record_add_field((coda_type_record *)type->base_type, field) != 0)
    {
        coda_type_record_field_delete(field);
        return -1;
    }
    /* update bit_size */
    type->bit_size = type->base_type->bit_size;
    return 0;
}